

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ConfigParseRank(char *zIn,char **pzRank,char **pzRankArgs)

{
  char *pcVar1;
  long lVar2;
  char *__dest;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *p;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  *pzRank = (char *)0x0;
  *pzRankArgs = (char *)0x0;
  if (zIn == (char *)0x0) {
    local_3c = 1;
    __dest = (char *)0x0;
  }
  else {
    do {
      pcVar5 = zIn;
      zIn = pcVar5 + 1;
    } while (*pcVar5 == ' ');
    lVar2 = -1;
    while (((long)zIn[lVar2] < 0 || ((&DAT_00208e80)[zIn[lVar2]] != '\0'))) {
      lVar2 = lVar2 + 1;
    }
    pcVar6 = zIn + lVar2;
    if (lVar2 == -1) {
      local_3c = 1;
      pcVar6 = (char *)0x0;
LAB_001df6cd:
      __dest = (char *)0x0;
    }
    else {
      __dest = (char *)sqlite3Fts5MallocZero(&local_3c,((long)pcVar6 - (long)pcVar5) + 1);
      if (__dest == (char *)0x0) goto LAB_001df6cd;
      memcpy(__dest,pcVar5,(long)pcVar6 - (long)pcVar5);
    }
    if (local_3c == 0) {
      do {
        pcVar5 = pcVar6;
        pcVar6 = pcVar5 + 1;
      } while (*pcVar5 == ' ');
      if (*pcVar5 != '(') {
        local_3c = 1;
      }
    }
    if (local_3c == 0) {
      pcVar5 = pcVar6 + -1;
      pcVar6 = pcVar6 + -2;
      pcVar7 = pcVar5;
      do {
        pcVar7 = pcVar7 + 1;
        pcVar6 = pcVar6 + 1;
        pcVar3 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar3 == ' ');
      pcVar3 = pcVar5;
      if (*pcVar5 != ')') {
        do {
          if (*pcVar3 != ' ') {
            pcVar3 = fts5ConfigSkipLiteral(pcVar3);
            if (pcVar3 == (char *)0x0) {
              pcVar3 = (char *)0x0;
            }
            else {
              pcVar4 = pcVar3 + -1;
              do {
                pcVar3 = pcVar4 + 1;
                pcVar1 = pcVar4 + 1;
                pcVar4 = pcVar3;
              } while (*pcVar1 == ' ');
            }
            if (pcVar3 == (char *)0x0) goto LAB_001df76a;
            if (*pcVar3 != ',') goto LAB_001df765;
          }
          pcVar3 = pcVar3 + 1;
        } while( true );
      }
      goto LAB_001df7a5;
    }
  }
  pcVar6 = (char *)0x0;
  goto LAB_001df7ab;
LAB_001df765:
  if (*pcVar3 != ')') {
LAB_001df76a:
    pcVar3 = (char *)0x0;
  }
  if (pcVar3 == (char *)0x0) {
    local_3c = 1;
  }
  else {
    pcVar6 = (char *)sqlite3Fts5MallocZero(&local_3c,(long)pcVar3 - (long)pcVar6);
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar6,pcVar5,(long)pcVar3 - (long)pcVar7);
      goto LAB_001df7ab;
    }
  }
LAB_001df7a5:
  pcVar6 = (char *)0x0;
LAB_001df7ab:
  if (local_3c == 0) {
    *pzRank = __dest;
    *pzRankArgs = pcVar6;
  }
  else {
    sqlite3_free(__dest);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5ConfigParseRank(
  const char *zIn,                /* Input string */
  char **pzRank,                  /* OUT: Rank function name */
  char **pzRankArgs               /* OUT: Rank function arguments */
){
  const char *p = zIn;
  const char *pRank;
  char *zRank = 0;
  char *zRankArgs = 0;
  int rc = SQLITE_OK;

  *pzRank = 0;
  *pzRankArgs = 0;

  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    p = fts5ConfigSkipWhitespace(p);
    pRank = p;
    p = fts5ConfigSkipBareword(p);

    if( p ){
      zRank = sqlite3Fts5MallocZero(&rc, 1 + p - pRank);
      if( zRank ) memcpy(zRank, pRank, p-pRank);
    }else{
      rc = SQLITE_ERROR;
    }

    if( rc==SQLITE_OK ){
      p = fts5ConfigSkipWhitespace(p);
      if( *p!='(' ) rc = SQLITE_ERROR;
      p++;
    }
    if( rc==SQLITE_OK ){
      const char *pArgs;
      p = fts5ConfigSkipWhitespace(p);
      pArgs = p;
      if( *p!=')' ){
        p = fts5ConfigSkipArgs(p);
        if( p==0 ){
          rc = SQLITE_ERROR;
        }else{
          zRankArgs = sqlite3Fts5MallocZero(&rc, 1 + p - pArgs);
          if( zRankArgs ) memcpy(zRankArgs, pArgs, p-pArgs);
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRank);
    assert( zRankArgs==0 );
  }else{
    *pzRank = zRank;
    *pzRankArgs = zRankArgs;
  }
  return rc;
}